

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O1

ErrorKind * __thiscall
Fixpp::result::Result<void,_Fixpp::ErrorKind>::unwrapErr
          (ErrorKind *__return_storage_ptr__,Result<void,_Fixpp::ErrorKind> *this)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t in_RCX;
  char *frame;
  VisitError<View> VStack_70;
  
  if (this->ok_ == false) {
    uVar2 = *(undefined4 *)((long)&(this->storage_).storage_ + 4);
    uVar3 = *(undefined4 *)((long)&(this->storage_).storage_ + 8);
    uVar4 = *(undefined4 *)((long)&(this->storage_).storage_ + 0xc);
    __return_storage_ptr__->type_ = *(Type *)&(this->storage_).storage_;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar2;
    *(undefined4 *)&__return_storage_ptr__->column_ = uVar3;
    *(undefined4 *)((long)&__return_storage_ptr__->column_ + 4) = uVar4;
    (__return_storage_ptr__->str_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_).field_2;
    lVar1 = *(long *)((long)&(this->storage_).storage_ + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str_,lVar1,
               *(long *)((long)&(this->storage_).storage_ + 0x18) + lVar1);
    return __return_storage_ptr__;
  }
  Result<void,Fixpp::ErrorKind>::unwrapErr();
  visitTagView<Fixpp::TagT<35u,Fixpp::Type::String>>(&VStack_70,(Fixpp *)this,frame,in_RCX);
  details::ok::impl::Map<std::__cxx11::string(std::pair<char_const*,unsigned_long>const&)>::
  map<std::pair<char_const*,unsigned_long>,Fixpp::ErrorKind,Fixpp::visitTag<Fixpp::TagT<35u,Fixpp::Type::String>>(char_const*,unsigned_long)::_lambda(std::pair<char_const*,unsigned_long>const&)_1_>
            (__return_storage_ptr__,
             (Map<std::__cxx11::string(std::pair<char_const*,unsigned_long>const&)> *)&VStack_70);
  if (((VStack_70.ok_ != true) && (VStack_70.storage_.initialized_ != false)) &&
     ((undefined1 *)VStack_70.storage_.storage_._16_8_ !=
      (undefined1 *)((long)&VStack_70.storage_.storage_ + 0x20))) {
    operator_delete((void *)VStack_70.storage_.storage_._16_8_,
                    VStack_70.storage_.storage_._32_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

E unwrapErr() const {
        if (isErr()) {
            return storage().template get<E>();
        }

        std::fprintf(stderr, "Attempting to unwrapErr an ok Result\n");
        std::terminate();
    }